

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Abc_NtkAreaOpt2(Sfm_Dec_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *vFront;
  int local_30;
  int nStop;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pObj;
  Sfm_Dec_t *p_local;
  
  iVar1 = Abc_NtkObjNumMax(p->pNtk);
  p_00 = Vec_PtrAlloc(1000);
  for (nStop = 0; iVar2 = Vec_PtrSize(p->pNtk->vObjs), nStop < iVar2; nStop = nStop + 1) {
    pAVar4 = Abc_NtkObj(p->pNtk,nStop);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 >> 5 & 1) != 0)) {
      __assert_fail("pObj->fMarkB == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                    ,0x799,"void Abc_NtkAreaOpt2(Sfm_Dec_t *)");
    }
  }
  for (nStop = 0; iVar2 = Abc_NtkCoNum(p->pNtk), nStop < iVar2; nStop = nStop + 1) {
    pAVar4 = Abc_NtkCo(p->pNtk,nStop);
    pAVar5 = Abc_ObjFanin0(pAVar4);
    iVar2 = Abc_ObjIsNode(pAVar5);
    if ((iVar2 != 0) &&
       (pAVar5 = Abc_ObjFanin0(pAVar4), (*(uint *)&pAVar5->field_0x14 >> 5 & 1) == 0)) {
      pAVar5 = Abc_ObjFanin0(pAVar4);
      *(uint *)&pAVar5->field_0x14 = *(uint *)&pAVar5->field_0x14 & 0xffffffdf | 0x20;
      pAVar4 = Abc_ObjFanin0(pAVar4);
      Vec_PtrPush(p_00,pAVar4);
    }
  }
  nStop = 0;
  do {
    iVar2 = Vec_PtrSize(p_00);
    if (iVar2 <= nStop) {
      for (nStop = 0; iVar1 = Vec_PtrSize(p->pNtk->vObjs), nStop < iVar1; nStop = nStop + 1) {
        pAVar4 = Abc_NtkObj(p->pNtk,nStop);
        if (pAVar4 != (Abc_Obj_t *)0x0) {
          *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffdf;
        }
      }
      Vec_PtrFree(p_00);
      return;
    }
    pFanin = (Abc_Obj_t *)Vec_PtrEntry(p_00,nStop);
    iVar2 = Abc_ObjIsNone(pFanin);
    if (iVar2 == 0) {
      uVar3 = Abc_ObjId(pFanin);
      pAVar4 = Abc_NtkAreaOptOne(p,uVar3);
      if (pAVar4 == (Abc_Obj_t *)0x0) {
LAB_0065aedb:
        for (local_30 = 0; iVar2 = Abc_ObjFaninNum(pFanin), local_30 < iVar2;
            local_30 = local_30 + 1) {
          pAVar4 = Abc_ObjFanin(pFanin,local_30);
          iVar2 = Abc_ObjIsNode(pAVar4);
          if (((iVar2 != 0) && (iVar2 = Abc_ObjFaninNum(pFanin), 0 < iVar2)) &&
             ((*(uint *)&pAVar4->field_0x14 >> 5 & 1) == 0)) {
            *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffdf | 0x20;
            Vec_PtrPush(p_00,pAVar4);
          }
        }
      }
      else {
        iVar2 = Abc_ObjIsNode(pAVar4);
        if (((iVar2 != 0) && (iVar2 = Abc_ObjFaninNum(pAVar4), iVar2 != 0)) &&
           ((*(uint *)&pAVar4->field_0x14 >> 5 & 1) == 0)) {
          uVar3 = Abc_ObjId(pAVar4);
          pFanin = pAVar4;
          if (iVar1 <= (int)uVar3) goto LAB_0065aedb;
          *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffdf | 0x20;
          Vec_PtrPush(p_00,pAVar4);
        }
      }
    }
    nStop = nStop + 1;
  } while( true );
}

Assistant:

void Abc_NtkAreaOpt2( Sfm_Dec_t * p )
{
    Abc_Obj_t * pObj, * pObjNew, * pFanin; 
    int i, k, nStop = Abc_NtkObjNumMax(p->pNtk);
    Vec_Ptr_t * vFront = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachObj( p->pNtk, pObj, i )
        assert( pObj->fMarkB == 0 );
    // start the queue of nodes to be tried
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) && !Abc_ObjFanin0(pObj)->fMarkB )
        {
            Abc_ObjFanin0(pObj)->fMarkB = 1;
            Vec_PtrPush( vFront, Abc_ObjFanin0(pObj) );
        }
    // process nodes in this order
    Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pObj, i )
    {
        if ( Abc_ObjIsNone(pObj) )
            continue;
        pObjNew = Abc_NtkAreaOptOne( p, Abc_ObjId(pObj) );
        if ( pObjNew != NULL )
        {
            if ( !Abc_ObjIsNode(pObjNew) || Abc_ObjFaninNum(pObjNew) == 0 || pObjNew->fMarkB )
                continue;
            if ( (int)Abc_ObjId(pObjNew) < nStop )
            {
                pObjNew->fMarkB = 1;
                Vec_PtrPush( vFront, pObjNew );
                continue;
            }
        }
        else
            pObjNew = pObj;
        Abc_ObjForEachFanin( pObjNew, pFanin, k )
            if ( Abc_ObjIsNode(pFanin) && Abc_ObjFaninNum(pObjNew) > 0 && !pFanin->fMarkB )
            {
                pFanin->fMarkB = 1;
                Vec_PtrPush( vFront, pFanin );
            }
    }
    Abc_NtkForEachObj( p->pNtk, pObj, i )
        pObj->fMarkB = 0;
    Vec_PtrFree( vFront );
}